

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd256.c
# Opt level: O3

int rmd256_done(hash_state *md,uchar *out)

{
  uint uVar1;
  ulong32 uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  if (md == (hash_state *)0x0) {
    rmd256_done_cold_1();
  }
  if (out == (uchar *)0x0) {
    rmd256_done_cold_2();
  }
  uVar3 = (ulong)(md->rmd128).curlen;
  if (0x3f < uVar3) {
    return 0x10;
  }
  md->data = (void *)((long)md->data + uVar3 * 8);
  (md->rmd128).curlen = (md->rmd128).curlen + 1;
  md->dummy[uVar3 + 8] = -0x80;
  uVar1 = (md->rmd128).curlen;
  uVar3 = (ulong)uVar1;
  if (uVar3 < 0x39) {
    if (uVar1 == 0x38) goto LAB_0017ca06;
  }
  else {
    if (uVar1 < 0x40) {
      pcVar4 = md->dummy + uVar3 + 8;
      uVar2 = uVar1 + 1;
      do {
        (md->rmd128).curlen = uVar2;
        *pcVar4 = '\0';
        pcVar4 = pcVar4 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x41);
    }
    rmd256_compress(md,(md->chc).state);
    uVar3 = 0;
  }
  pcVar4 = md->dummy + uVar3 + 8;
  uVar2 = (int)uVar3 + 1;
  do {
    (md->rmd128).curlen = uVar2;
    *pcVar4 = '\0';
    pcVar4 = pcVar4 + 1;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x39);
LAB_0017ca06:
  (md->whirlpool).state[7] = (md->chc).length;
  rmd256_compress(md,(md->chc).state);
  lVar5 = 0;
  do {
    *(undefined4 *)(out + lVar5 * 4) = *(undefined4 *)((long)md + lVar5 * 4 + 0x4c);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  return 0;
}

Assistant:

int rmd256_done(hash_state * md, unsigned char *out)
{
    int i;

    LTC_ARGCHK(md  != NULL);
    LTC_ARGCHK(out != NULL);

    if (md->rmd256.curlen >= sizeof(md->rmd256.buf)) {
       return CRYPT_INVALID_ARG;
    }


    /* increase the length of the message */
    md->rmd256.length += md->rmd256.curlen * 8;

    /* append the '1' bit */
    md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->rmd256.curlen > 56) {
        while (md->rmd256.curlen < 64) {
            md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
        }
        rmd256_compress(md, md->rmd256.buf);
        md->rmd256.curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->rmd256.curlen < 56) {
        md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64L(md->rmd256.length, md->rmd256.buf+56);
    rmd256_compress(md, md->rmd256.buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE32L(md->rmd256.state[i], out+(4*i));
    }
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
   return CRYPT_OK;
}